

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::CalcTextSize(char *text,char *text_end,bool hide_text_after_double_hash,
                          float wrap_width)

{
  float size;
  ImFont *this;
  ImGuiContext *pIVar1;
  undefined7 in_register_00000011;
  ImVec2 IVar2;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar3 [16];
  float fVar4;
  
  pIVar1 = GImGui;
  if ((int)CONCAT71(in_register_00000011,hide_text_after_double_hash) != 0) {
    text_end = FindRenderedTextEnd(text,text_end);
  }
  size = pIVar1->FontSize;
  if (text_end == text) {
    IVar2 = (ImVec2)((ulong)(uint)size << 0x20);
  }
  else {
    this = pIVar1->Font;
    IVar2 = ImFont::CalcTextSizeA(this,size,3.4028235e+38,wrap_width,text,text_end,(char **)0x0);
    fVar4 = IVar2.x;
    auVar3._4_4_ = IVar2.y;
    auVar3._8_4_ = (undefined4)extraout_XMM0_Qb;
    auVar3._12_4_ = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
    if (0.0 < fVar4) {
      fVar4 = fVar4 - size / this->FontSize;
    }
    auVar3._0_4_ = (float)(int)(fVar4 + 0.95);
    IVar2 = auVar3._0_8_;
  }
  return IVar2;
}

Assistant:

ImVec2 ImGui::CalcTextSize(const char* text, const char* text_end, bool hide_text_after_double_hash, float wrap_width)
{
    ImGuiContext& g = *GImGui;

    const char* text_display_end;
    if (hide_text_after_double_hash)
        text_display_end = FindRenderedTextEnd(text, text_end);      // Hide anything after a '##' string
    else
        text_display_end = text_end;

    ImFont* font = g.Font;
    const float font_size = g.FontSize;
    if (text == text_display_end)
        return ImVec2(0.0f, font_size);
    ImVec2 text_size = font->CalcTextSizeA(font_size, FLT_MAX, wrap_width, text, text_display_end, NULL);

    // Cancel out character spacing for the last character of a line (it is baked into glyph->XAdvance field)
    const float font_scale = font_size / font->FontSize;
    const float character_spacing_x = 1.0f * font_scale;
    if (text_size.x > 0.0f)
        text_size.x -= character_spacing_x;
    text_size.x = (float)(int)(text_size.x + 0.95f);

    return text_size;
}